

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teamcity_messages.cpp
# Opt level: O2

void __thiscall
jetbrains::teamcity::TeamcityMessages::testOutput
          (TeamcityMessages *this,string *name,string *output,string *flowId,bool isStdError)

{
  string *value;
  char *name_00;
  undefined3 in_register_00000081;
  RaiiMessage msg;
  RaiiMessage local_80;
  string local_78 [32];
  string local_58;
  string local_38;
  
  name_00 = "testStdOut";
  if (CONCAT31(in_register_00000081,isStdError) != 0) {
    name_00 = "testStdErr";
  }
  anon_unknown_1::RaiiMessage::RaiiMessage(&local_80,name_00,this->m_out);
  std::__cxx11::string::string((string *)&local_38,(string *)name);
  anon_unknown_1::RaiiMessage::writeProperty(&local_80,"name",&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string((string *)&local_58,(string *)output);
  anon_unknown_1::RaiiMessage::writeProperty(&local_80,"out",&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string(local_78,(string *)flowId);
  anon_unknown_1::RaiiMessage::writePropertyIfNonEmpty(&local_80,(char *)local_78,value);
  std::__cxx11::string::~string(local_78);
  anon_unknown_1::RaiiMessage::~RaiiMessage(&local_80);
  return;
}

Assistant:

void TeamcityMessages::testOutput(const std::string& name, const std::string& output, const std::string& flowId, const bool isStdError)
{
    RaiiMessage msg(isStdError ? "testStdErr" : "testStdOut", *m_out);
    msg.writeProperty("name", name);
    msg.writeProperty("out", output);
    msg.writePropertyIfNonEmpty("flowId", flowId);
}